

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushUnaryMinus.cpp
# Opt level: O3

ostream * Inferences::operator<<(ostream *out,UMinus *self)

{
  long lVar1;
  char *pcVar2;
  
  switch(*self) {
  case Int:
    pcVar2 = "UMinus::Int";
    break;
  case Rat:
    pcVar2 = "UMinus::Rat";
    break;
  case Real:
    pcVar2 = "UMinus::Real";
    goto LAB_005083b5;
  case None:
    pcVar2 = "UMinus::None";
LAB_005083b5:
    lVar1 = 0xc;
    goto LAB_005083d6;
  default:
    pcVar2 = "UNKNOWN";
    lVar1 = 7;
    goto LAB_005083d6;
  }
  lVar1 = 0xb;
LAB_005083d6:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,lVar1);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, UMinus const& self) {
  switch(self) {
    case UMinus::Int: return out << "UMinus::Int";
    case UMinus::Rat: return out << "UMinus::Rat";
    case UMinus::Real: return out << "UMinus::Real";
    case UMinus::None: return out << "UMinus::None";
    default:
      return out << "UNKNOWN";
  }
  ASSERTION_VIOLATION
}